

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BackupUpdate(sqlite3_backup *pBackup,Pgno iPage,u8 *aData)

{
  int iVar1;
  sqlite3_backup *psStack_28;
  int rc;
  sqlite3_backup *p;
  u8 *aData_local;
  Pgno iPage_local;
  sqlite3_backup *pBackup_local;
  
  for (psStack_28 = pBackup; psStack_28 != (sqlite3_backup *)0x0; psStack_28 = psStack_28->pNext) {
    iVar1 = isFatalError(psStack_28->rc);
    if ((iVar1 == 0) && (iPage < psStack_28->iNext)) {
      sqlite3_mutex_enter(psStack_28->pDestDb->mutex);
      iVar1 = backupOnePage(psStack_28,iPage,aData,1);
      sqlite3_mutex_leave(psStack_28->pDestDb->mutex);
      if (iVar1 != 0) {
        psStack_28->rc = iVar1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BackupUpdate(sqlite3_backup *pBackup, Pgno iPage, const u8 *aData){
  sqlite3_backup *p;                   /* Iterator variable */
  for(p=pBackup; p; p=p->pNext){
    assert( sqlite3_mutex_held(p->pSrc->pBt->mutex) );
    if( !isFatalError(p->rc) && iPage<p->iNext ){
      /* The backup process p has already copied page iPage. But now it
      ** has been modified by a transaction on the source pager. Copy
      ** the new data into the backup.
      */
      int rc;
      assert( p->pDestDb );
      sqlite3_mutex_enter(p->pDestDb->mutex);
      rc = backupOnePage(p, iPage, aData, 1);
      sqlite3_mutex_leave(p->pDestDb->mutex);
      assert( rc!=SQLITE_BUSY && rc!=SQLITE_LOCKED );
      if( rc!=SQLITE_OK ){
        p->rc = rc;
      }
    }
  }
}